

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::SLUFactorRational::freeAll(SLUFactorRational *this)

{
  int *piVar1;
  Dring *pDVar2;
  
  piVar1 = (this->super_CLUFactorRational).row.perm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).row.perm = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).row.orig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).row.orig = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).col.perm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).col.perm = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).col.orig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).col.orig = (int *)0x0;
  }
  pDVar2 = (this->super_CLUFactorRational).u.row.elem;
  if (pDVar2 != (Dring *)0x0) {
    free(pDVar2);
    (this->super_CLUFactorRational).u.row.elem = (Dring *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.row.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.row.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.row.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.row.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.row.len;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.row.len = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.row.max;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.row.max = (int *)0x0;
  }
  pDVar2 = (this->super_CLUFactorRational).u.col.elem;
  if (pDVar2 != (Dring *)0x0) {
    free(pDVar2);
    (this->super_CLUFactorRational).u.col.elem = (Dring *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.col.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.col.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.col.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.col.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.col.len;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.col.len = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).u.col.max;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).u.col.max = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.row;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.row = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.ridx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.ridx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.rbeg;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.rbeg = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.rorig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.rorig = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactorRational).l.rperm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactorRational).l.rperm = (int *)0x0;
  }
  free(this->solveTime);
  this->solveTime = (Timer *)0x0;
  free((this->super_CLUFactorRational).factorTime);
  (this->super_CLUFactorRational).factorTime = (Timer *)0x0;
  return;
}

Assistant:

inline void SLUFactorRational::freeAll()
{

   if(row.perm)
      spx_free(row.perm);

   if(row.orig)
      spx_free(row.orig);

   if(col.perm)
      spx_free(col.perm);

   if(col.orig)
      spx_free(col.orig);

   if(u.row.elem)
      spx_free(u.row.elem);

   if(u.row.idx)
      spx_free(u.row.idx);

   if(u.row.start)
      spx_free(u.row.start);

   if(u.row.len)
      spx_free(u.row.len);

   if(u.row.max)
      spx_free(u.row.max);

   if(u.col.elem)
      spx_free(u.col.elem);

   if(u.col.idx)
      spx_free(u.col.idx);

   if(u.col.start)
      spx_free(u.col.start);

   if(u.col.len)
      spx_free(u.col.len);

   if(u.col.max)
      spx_free(u.col.max);

   if(l.idx)
      spx_free(l.idx);

   if(l.start)
      spx_free(l.start);

   if(l.row)
      spx_free(l.row);

   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   spx_free(solveTime);
   spx_free(factorTime);
}